

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::
     call_func<bool(*)(chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&)noexcept,bool,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&,0ul,1ul>
               (_func_bool_Boxed_Value_ptr_Boxed_Value_ptr **param_1,Function_Params *param_2,
               Function_Params *param_3,Type_Conversions_State *param_4)

{
  Boxed_Value *pBVar1;
  byte bVar2;
  Boxed_Value *pBVar3;
  Boxed_Value BVar4;
  Boxed_Value local_50;
  Boxed_Value local_40;
  Type_Conversions_State *local_30;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_bool_Boxed_Value_ptr_Boxed_Value_ptr **f_local;
  _func_bool_Boxed_Value_ptr_Boxed_Value_ptr *param_0_local;
  
  pBVar1 = param_2->m_begin;
  local_30 = param_4;
  t_conversions_local = (Type_Conversions_State *)param_3;
  params_local = param_2;
  f_local = param_1;
  pBVar3 = Function_Params::operator[](param_3,0);
  boxed_cast<chaiscript::Boxed_Value_const&>((chaiscript *)&local_40,pBVar3,local_30);
  pBVar3 = Function_Params::operator[]((Function_Params *)t_conversions_local,1);
  BVar4 = boxed_cast<chaiscript::Boxed_Value_const&>((chaiscript *)&local_50,pBVar3,local_30);
  bVar2 = (*(code *)pBVar1)(&local_40,&local_50,
                            BVar4.m_data.
                            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
  Boxed_Value::~Boxed_Value(&local_50);
  Boxed_Value::~Boxed_Value(&local_40);
  return (bool)(bVar2 & 1);
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }